

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

string * __thiscall
Shell::resultToString_abi_cxx11_(string *__return_storage_ptr__,Shell *this,ActionResult *result)

{
  Literals LVar1;
  add_pointer_t<Shell::TrapResult> ptVar2;
  add_pointer_t<Shell::HostLimitResult> ptVar3;
  add_pointer_t<Shell::ExceptionResult> ptVar4;
  undefined8 in_stack_fffffffffffffdc8;
  ostream *poVar5;
  undefined8 in_stack_fffffffffffffdd8;
  allocator<char> *paVar6;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  string *psVar7;
  Literals local_200;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [376];
  Literals *local_40;
  type *vals;
  allocator<char> local_21;
  variant<wasm::Literals,_Shell::TrapResult,_Shell::HostLimitResult,_Shell::ExceptionResult>
  *local_20;
  ActionResult *result_local;
  Shell *this_local;
  
  psVar7 = __return_storage_ptr__;
  local_20 = result;
  result_local = (ActionResult *)this;
  this_local = (Shell *)__return_storage_ptr__;
  ptVar2 = std::
           get_if<Shell::TrapResult,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                     (result);
  if (ptVar2 == (add_pointer_t<Shell::TrapResult>)0x0) {
    ptVar3 = std::
             get_if<Shell::HostLimitResult,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                       (local_20);
    if (ptVar3 == (add_pointer_t<Shell::HostLimitResult>)0x0) {
      ptVar4 = std::
               get_if<Shell::ExceptionResult,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                         (local_20);
      if (ptVar4 == (add_pointer_t<Shell::ExceptionResult>)0x0) {
        local_40 = std::
                   get_if<wasm::Literals,wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                             (local_20);
        if (local_40 == (add_pointer_t<wasm::Literals>)0x0) {
          ::wasm::handle_unreachable
                    ("unexpected result",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                     ,0xcc);
        }
        std::__cxx11::stringstream::stringstream(local_1c8);
        poVar5 = local_1b8;
        ::wasm::Literals::Literals(&local_200,local_40);
        LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.gcData.
        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)poVar5
        ;
        LVar1.super_SmallVector<wasm::Literal,_1UL>.usedFixed = in_stack_fffffffffffffdc8;
        LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
        ._M_str = (char *)in_stack_fffffffffffffdd8;
        LVar1.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
             in_stack_fffffffffffffde0;
        LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffde8;
        LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)__return_storage_ptr__;
        LVar1.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)psVar7;
        ::wasm::operator<<(poVar5,LVar1);
        ::wasm::Literals::~Literals(&local_200);
        std::__cxx11::stringstream::str();
        std::__cxx11::stringstream::~stringstream(local_1c8);
      }
      else {
        paVar6 = (allocator<char> *)((long)&vals + 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"exception",paVar6);
        std::allocator<char>::~allocator((allocator<char> *)((long)&vals + 2));
      }
    }
    else {
      paVar6 = (allocator<char> *)((long)&vals + 3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"exceeded host limit",paVar6);
      std::allocator<char>::~allocator((allocator<char> *)((long)&vals + 3));
    }
  }
  else {
    paVar6 = &local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"trap",paVar6);
    std::allocator<char>::~allocator(&local_21);
  }
  return psVar7;
}

Assistant:

std::string resultToString(ActionResult& result) {
    if (std::get_if<TrapResult>(&result)) {
      return "trap";
    } else if (std::get_if<HostLimitResult>(&result)) {
      return "exceeded host limit";
    } else if (std::get_if<ExceptionResult>(&result)) {
      return "exception";
    } else if (auto* vals = std::get_if<Literals>(&result)) {
      std::stringstream ss;
      ss << *vals;
      return ss.str();
    } else {
      WASM_UNREACHABLE("unexpected result");
    }
  }